

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O0

int Res_FilterCandidates
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax,int fArea)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  Abc_Obj_t *pAVar5;
  uint *r;
  uint *puVar6;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  int local_94;
  int k;
  int iDiv2;
  int iDiv;
  int d2;
  int d;
  int i2;
  int i;
  int RetValue;
  int Counter;
  uint *pInfoDiv2;
  uint *pInfoDiv;
  uint *pInfo;
  Abc_Obj_t *pFaninTemp;
  Abc_Obj_t *pFanin2;
  Abc_Obj_t *pFanin;
  int nFaninsMax_local;
  Vec_Vec_t *vResubsW_local;
  Vec_Vec_t *vResubs_local;
  Res_Sim_t *pSim_local;
  Abc_Ntk_t *pAig_local;
  Res_Win_t *pWin_local;
  
  puVar4 = (uint *)Vec_PtrEntry(pSim->vOuts,1);
  iVar1 = Abc_InfoIsOne(puVar4,pSim->nWordsOut);
  if (iVar1 == 0) {
    pWin_local._4_4_ = 0;
  }
  else {
    puVar4 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
    iVar1 = Abc_InfoIsOne(puVar4,pSim->nWordsOut);
    if (iVar1 == 0) {
      pWin_local._4_4_ = 0;
    }
    else {
      i = 0;
      Vec_VecClear(vResubs);
      Vec_VecClear(vResubsW);
      for (d = 0; iVar1 = Abc_ObjFaninNum(pWin->pNode), d < iVar1; d = d + 1) {
        pAVar5 = Abc_ObjFanin(pWin->pNode,d);
        if ((fArea == 0) || (iVar1 = Abc_ObjFanoutNum(pAVar5), iVar1 < 2)) {
          puVar4 = Res_FilterCollectFaninInfo(pWin,pSim,1 << ((byte)d & 0x1f) ^ 0xffffffff);
          iVar1 = Abc_InfoIsOne(puVar4,pSim->nWordsOut);
          if (iVar1 != 0) {
            pAVar5 = Abc_NtkPo(pAig,0);
            Vec_VecPush(vResubs,i,pAVar5);
            pAVar5 = Abc_NtkPo(pAig,1);
            Vec_VecPush(vResubs,i,pAVar5);
            for (local_94 = 0; iVar1 = Abc_ObjFaninNum(pWin->pNode), local_94 < iVar1;
                local_94 = local_94 + 1) {
              pAVar5 = Abc_ObjFanin(pWin->pNode,local_94);
              if (local_94 != d) {
                pAVar7 = Abc_NtkPo(pAig,local_94 + 2);
                Vec_VecPush(vResubs,i,pAVar7);
                Vec_VecPush(vResubsW,i,pAVar5);
              }
            }
            i = i + 1;
            iVar1 = Vec_VecSize(vResubs);
            if (i == iVar1) {
              return i;
            }
          }
        }
      }
      for (d = 0; iVar1 = Abc_ObjFaninNum(pWin->pNode), d < iVar1; d = d + 1) {
        pAVar5 = Abc_ObjFanin(pWin->pNode,d);
        iVar1 = Abc_ObjFanoutNum(pAVar5);
        if (iVar1 < 2) {
          puVar4 = Res_FilterCollectFaninInfo(pWin,pSim,1 << ((byte)d & 0x1f) ^ 0xffffffff);
          iVar1 = Abc_ObjFaninNum(pWin->pNode);
          for (iDiv = iVar1 + 2; iVar1 = Abc_NtkPoNum(pAig), iDiv < iVar1; iDiv = iDiv + 1) {
            puVar6 = (uint *)Vec_PtrEntry(pSim->vOuts,iDiv);
            iVar1 = Abc_ObjFaninNum(pWin->pNode);
            iVar3 = Abc_InfoIsOrOne(puVar4,puVar6,pSim->nWordsOut);
            if (iVar3 != 0) {
              pAVar5 = Abc_NtkPo(pAig,0);
              Vec_VecPush(vResubs,i,pAVar5);
              pAVar5 = Abc_NtkPo(pAig,1);
              Vec_VecPush(vResubs,i,pAVar5);
              for (local_94 = 0; iVar3 = Abc_ObjFaninNum(pWin->pNode), local_94 < iVar3;
                  local_94 = local_94 + 1) {
                pAVar5 = Abc_ObjFanin(pWin->pNode,local_94);
                if (local_94 != d) {
                  pAVar7 = Abc_NtkPo(pAig,local_94 + 2);
                  Vec_VecPush(vResubs,i,pAVar7);
                  Vec_VecPush(vResubsW,i,pAVar5);
                }
              }
              pAVar5 = Abc_NtkPo(pAig,iDiv);
              Vec_VecPush(vResubs,i,pAVar5);
              pvVar8 = Vec_PtrEntry(pWin->vDivs,iDiv - (iVar1 + 2));
              Vec_VecPush(vResubsW,i,pvVar8);
              i = i + 1;
              iVar1 = Vec_VecSize(vResubs);
              if (i == iVar1) {
                return i;
              }
            }
          }
        }
      }
      iVar1 = Abc_ObjFaninNum(pWin->pNode);
      if (iVar1 < nFaninsMax) {
        for (d = 0; iVar1 = Abc_ObjFaninNum(pWin->pNode), d < iVar1; d = d + 1) {
          pAVar5 = Abc_ObjFanin(pWin->pNode,d);
          iVar1 = Abc_ObjFanoutNum(pAVar5);
          if (iVar1 < 2) {
            puVar4 = Res_FilterCollectFaninInfo(pWin,pSim,1 << ((byte)d & 0x1f) ^ 0xffffffff);
            iVar1 = Abc_ObjFaninNum(pWin->pNode);
            for (iDiv = iVar1 + 2; iVar1 = Abc_NtkPoNum(pAig), iDiv < iVar1; iDiv = iDiv + 1) {
              puVar6 = (uint *)Vec_PtrEntry(pSim->vOuts,iDiv);
              iVar1 = Abc_ObjFaninNum(pWin->pNode);
              iDiv2 = iDiv;
              while( true ) {
                iDiv2 = iDiv2 + 1;
                iVar3 = Abc_NtkPoNum(pAig);
                if (iVar3 <= iDiv2) break;
                r = (uint *)Vec_PtrEntry(pSim->vOuts,iDiv2);
                iVar3 = Abc_ObjFaninNum(pWin->pNode);
                iVar2 = Abc_InfoIsOrOne3(puVar4,puVar6,r,pSim->nWordsOut);
                if (iVar2 != 0) {
                  pAVar5 = Abc_NtkPo(pAig,0);
                  Vec_VecPush(vResubs,i,pAVar5);
                  pAVar5 = Abc_NtkPo(pAig,1);
                  Vec_VecPush(vResubs,i,pAVar5);
                  for (local_94 = 0; iVar2 = Abc_ObjFaninNum(pWin->pNode), local_94 < iVar2;
                      local_94 = local_94 + 1) {
                    pAVar5 = Abc_ObjFanin(pWin->pNode,local_94);
                    if (local_94 != d) {
                      pAVar7 = Abc_NtkPo(pAig,local_94 + 2);
                      Vec_VecPush(vResubs,i,pAVar7);
                      Vec_VecPush(vResubsW,i,pAVar5);
                    }
                  }
                  pAVar5 = Abc_NtkPo(pAig,iDiv);
                  Vec_VecPush(vResubs,i,pAVar5);
                  pAVar5 = Abc_NtkPo(pAig,iDiv2);
                  Vec_VecPush(vResubs,i,pAVar5);
                  pvVar8 = Vec_PtrEntry(pWin->vDivs,iDiv - (iVar1 + 2));
                  Vec_VecPush(vResubsW,i,pvVar8);
                  pvVar8 = Vec_PtrEntry(pWin->vDivs,iDiv2 - (iVar3 + 2));
                  Vec_VecPush(vResubsW,i,pvVar8);
                  i = i + 1;
                  iVar3 = Vec_VecSize(vResubs);
                  if (i == iVar3) {
                    return i;
                  }
                }
              }
            }
          }
        }
      }
      if (fArea == 0) {
        for (d = 0; iVar1 = Abc_ObjFaninNum(pWin->pNode), d < iVar1; d = d + 1) {
          Abc_ObjFanin(pWin->pNode,d);
          d2 = d;
          while( true ) {
            d2 = d2 + 1;
            iVar1 = Abc_ObjFaninNum(pWin->pNode);
            if (iVar1 <= d2) break;
            Abc_ObjFanin(pWin->pNode,d2);
            puVar4 = Res_FilterCollectFaninInfo
                               (pWin,pSim,
                                (1 << ((byte)d & 0x1f) ^ 0xffffffffU) &
                                (1 << ((byte)d2 & 0x1f) ^ 0xffffffffU));
            iVar1 = Abc_ObjFaninNum(pWin->pNode);
            for (iDiv = iVar1 + 2; iVar1 = Abc_NtkPoNum(pAig), iDiv < iVar1; iDiv = iDiv + 1) {
              puVar6 = (uint *)Vec_PtrEntry(pSim->vOuts,iDiv);
              iVar1 = Abc_ObjFaninNum(pWin->pNode);
              iVar3 = Abc_InfoIsOrOne(puVar4,puVar6,pSim->nWordsOut);
              if (iVar3 != 0) {
                pAVar5 = Abc_NtkPo(pAig,0);
                Vec_VecPush(vResubs,i,pAVar5);
                pAVar5 = Abc_NtkPo(pAig,1);
                Vec_VecPush(vResubs,i,pAVar5);
                for (local_94 = 0; iVar3 = Abc_ObjFaninNum(pWin->pNode), local_94 < iVar3;
                    local_94 = local_94 + 1) {
                  pAVar5 = Abc_ObjFanin(pWin->pNode,local_94);
                  if ((local_94 != d) && (local_94 != d2)) {
                    pAVar7 = Abc_NtkPo(pAig,local_94 + 2);
                    Vec_VecPush(vResubs,i,pAVar7);
                    Vec_VecPush(vResubsW,i,pAVar5);
                  }
                }
                pAVar5 = Abc_NtkPo(pAig,iDiv);
                Vec_VecPush(vResubs,i,pAVar5);
                pvVar8 = Vec_PtrEntry(pWin->vDivs,iDiv - (iVar1 + 2));
                Vec_VecPush(vResubsW,i,pvVar8);
                i = i + 1;
                iVar1 = Vec_VecSize(vResubs);
                if (i == iVar1) {
                  return i;
                }
              }
            }
          }
        }
      }
      pWin_local._4_4_ = i;
    }
  }
  return pWin_local._4_4_;
}

Assistant:

int Res_FilterCandidates( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax, int fArea )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFaninTemp;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, i, i2, d, d2, iDiv, iDiv2, k;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing each fanin
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( fArea && Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
        if ( RetValue )
        {
//            printf( "Node %4d. Candidate fanin %4d.\n", pWin->pNode->Id, pFanin->Id );
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;    
        }
    }

    // try replacing each critical fanin by a non-critical fanin
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        // go over the set of divisors
        for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
        {
            pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
            iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
            if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;           
        }
    }

    // consider the case when two fanins can be added instead of one
    if ( Abc_ObjFaninNum(pWin->pNode) < nFaninsMax )
    {
        // try to replace each critical fanin by two non-critical fanins
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            if ( Abc_ObjFanoutNum(pFanin) > 1 )
                continue;
            // get simulation info without this fanin
            pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
            // go over the set of divisors
            for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
            {
                pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                // go through the second divisor
                for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
                {
                    pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
                    iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }

    // try to replace two nets by one
    if ( !fArea )
    {
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            for ( i2 = i + 1; i2 < Abc_ObjFaninNum(pWin->pNode); i2++ )
            {
                pFanin2 = Abc_ObjFanin(pWin->pNode, i2);
                // get simulation info without these fanins
                pInfo = Res_FilterCollectFaninInfo( pWin, pSim, (~(1 << i)) & (~(1 << i2)) );
                // go over the set of divisors
                for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
                {
                    pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                    iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i && k != i2 )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }
    return Counter;
}